

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_load(lua_State *L,lua_Reader reader,void *data,char *chunkname,char *mode)

{
  int *piVar1;
  int iVar2;
  char *name;
  ZIO z;
  ZIO local_50;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x545,"int lua_load(lua_State *, lua_Reader, void *, const char *, const char *)"
                 );
  }
  name = "?";
  if (chunkname != (char *)0x0) {
    name = chunkname;
  }
  luaZ_init(L,&local_50,reader,data);
  iVar2 = luaD_protectedparser(L,&local_50,name,mode);
  if (iVar2 == 0) {
    ravi_closure_setenv(L);
  }
  piVar1 = *(int **)&L[-1].hookmask;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    return iVar2;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x54c,"int lua_load(lua_State *, lua_Reader, void *, const char *, const char *)");
}

Assistant:

LUA_API int lua_load (lua_State *L, lua_Reader reader, void *data,
                      const char *chunkname, const char *mode) {
  ZIO z;
  int status;
  lua_lock(L);
  if (!chunkname) chunkname = "?";
  luaZ_init(L, &z, reader, data);
  status = luaD_protectedparser(L, &z, chunkname, mode);
  if (status == LUA_OK) {  /* no errors? */
    ravi_closure_setenv(L);
  }
  lua_unlock(L);
  return status;
}